

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::kf_lines_down(Fl_Input *this,int repeat_num)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int local_20;
  int local_1c;
  int i;
  int repeat_num_local;
  Fl_Input *this_local;
  
  local_20 = Fl_Input_::position(&this->super_Fl_Input_);
  iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,local_20);
  iVar3 = Fl_Input_::size(&this->super_Fl_Input_);
  local_1c = repeat_num;
  if (iVar2 < iVar3) {
    while (local_1c != 0) {
      local_20 = Fl_Input_::line_end(&this->super_Fl_Input_,local_20);
      iVar2 = Fl_Input_::size(&this->super_Fl_Input_);
      if (iVar2 <= local_20) break;
      local_20 = local_20 + 1;
      local_1c = local_1c + -1;
    }
    shift_up_down_position(this,local_20);
    this_local._4_4_ = 1;
  }
  else {
    bVar1 = Fl::option(OPTION_ARROW_FOCUS);
    this_local._4_4_ = (uint)!bVar1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input::kf_lines_down(int repeat_num) {
  int i = position();
  if (line_end(i) >= size()) {
    //UNNEEDED if (input_type()==FL_MULTILINE_INPUT && !Fl::option(Fl::OPTION_ARROW_FOCUS)) return 1;
    return NORMAL_INPUT_MOVE;
  }
  while (repeat_num--) {  
    i = line_end(i);
    if (i >= size()) break;
    i++;
  }
  shift_up_down_position(i);
  return 1;
}